

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.h
# Opt level: O0

mp_int * mp__from_string_literal(char *lit)

{
  char *lit_local;
  
  if ((*lit == '\0') || ((lit[1] != 'x' && (lit[1] != 'X')))) {
    lit_local = (char *)mp_from_decimal(lit);
  }
  else {
    lit_local = (char *)mp_from_hex(lit + 2);
  }
  return (mp_int *)lit_local;
}

Assistant:

static inline mp_int *mp__from_string_literal(const char *lit)
{
    /* Don't call this directly; it's not equipped to deal with
     * hostile data. Use only via the MP_LITERAL macro. */
    if (lit[0] && (lit[1] == 'x' || lit[1] == 'X'))
        return mp_from_hex(lit+2);
    else
        return mp_from_decimal(lit);
}